

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O0

bool bssl::tls_has_unprocessed_handshake_data(SSL *ssl)

{
  bool bVar1;
  pointer pbVar2;
  bool local_49;
  size_t local_48;
  size_t unused;
  SSLMessage msg;
  size_t msg_len;
  SSL *ssl_local;
  
  msg.raw.len = 0;
  if (((*(ushort *)&ssl->s3->field_0xdc >> 3 & 1) != 0) &&
     (bVar1 = parse_message(ssl,(SSLMessage *)&unused,&local_48), bVar1)) {
    msg.raw.len = CBS_len((CBS *)&msg.body.len);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->s3->hs_buf);
  local_49 = false;
  if (bVar1) {
    pbVar2 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&ssl->s3->hs_buf);
    local_49 = msg.raw.len < pbVar2->length;
  }
  return local_49;
}

Assistant:

bool tls_has_unprocessed_handshake_data(const SSL *ssl) {
  size_t msg_len = 0;
  if (ssl->s3->has_message) {
    SSLMessage msg;
    size_t unused;
    if (parse_message(ssl, &msg, &unused)) {
      msg_len = CBS_len(&msg.raw);
    }
  }

  return ssl->s3->hs_buf && ssl->s3->hs_buf->length > msg_len;
}